

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O2

basic_executor_type<std::allocator<void>,_0UL> * __thiscall
asio::execution::detail::any_executor_base::
target<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(any_executor_base *this)

{
  bool bVar1;
  type_info *this_00;
  target_fns *ptVar2;
  
  if (this->target_fns_ != (target_fns *)0x0) {
    this_00 = (type_info *)(*(code *)**(undefined8 **)&this[1].object_)();
    bVar1 = CLI::std::type_info::operator==
                      (this_00,(type_info *)
                               &asio::io_context::basic_executor_type<std::allocator<void>,0ul>::
                                typeinfo);
    if (bVar1) {
      ptVar2 = this->target_fns_;
    }
    else {
      ptVar2 = (target_fns *)0x0;
    }
    return (basic_executor_type<std::allocator<void>,_0UL> *)ptVar2;
  }
  return (basic_executor_type<std::allocator<void>,_0UL> *)0x0;
}

Assistant:

const Executor* target() const
  {
    return target_ && (is_same<Executor, void>::value
        || target_fns_->target_type() == target_type_ex<Executor>())
      ? static_cast<const Executor*>(target_) : 0;
  }